

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fees.cpp
# Opt level: O2

CFeeRate __thiscall
CBlockPolicyEstimator::estimateRawFee
          (CBlockPolicyEstimator *this,int confTarget,double successThreshold,
          FeeEstimateHorizon horizon,EstimationResult *result)

{
  long lVar1;
  TxConfirmStats *this_00;
  longlong lVar2;
  long in_FS_OFFSET;
  double dVar3;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock3;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (horizon < (LONG_HALFLIFE|MED_HALFLIFE)) {
    this_00 = *(TxConfirmStats **)
               ((long)&(this->super_CValidationInterface)._vptr_CValidationInterface +
               *(long *)(&DAT_00ccd208 + (ulong)horizon * 8));
    if (this_00 != (TxConfirmStats *)0x0) {
      dVar3 = *(double *)(&DAT_00ccd1f0 + (ulong)horizon * 8);
      lVar2 = 0;
      UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
                (&criticalblock3,&this->m_cs_fee_estimator,"m_cs_fee_estimator",
                 "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/policy/fees.cpp"
                 ,0x2e8,false);
      if (0 < confTarget) {
        lVar2 = 0;
        if ((successThreshold <= 1.0) &&
           ((uint)confTarget <=
            (int)(((long)(this_00->confAvg).
                         super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(this_00->confAvg).
                        super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start) / 0x18) * this_00->scale)) {
          dVar3 = TxConfirmStats::EstimateMedianVal
                            (this_00,confTarget,dVar3,successThreshold,this->nBestSeenHeight,result)
          ;
          if (0.0 <= dVar3) {
            lVar2 = llround(dVar3);
          }
          else {
            lVar2 = 0;
          }
        }
      }
      std::unique_lock<std::mutex>::~unique_lock(&criticalblock3.super_unique_lock);
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        return (CFeeRate)lVar2;
      }
      __stack_chk_fail();
    }
  }
  __assert_fail("stats",
                "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/policy/fees.cpp"
                ,0x2e6,
                "CFeeRate CBlockPolicyEstimator::estimateRawFee(int, double, FeeEstimateHorizon, EstimationResult *) const"
               );
}

Assistant:

CFeeRate CBlockPolicyEstimator::estimateRawFee(int confTarget, double successThreshold, FeeEstimateHorizon horizon, EstimationResult* result) const
{
    TxConfirmStats* stats = nullptr;
    double sufficientTxs = SUFFICIENT_FEETXS;
    switch (horizon) {
    case FeeEstimateHorizon::SHORT_HALFLIFE: {
        stats = shortStats.get();
        sufficientTxs = SUFFICIENT_TXS_SHORT;
        break;
    }
    case FeeEstimateHorizon::MED_HALFLIFE: {
        stats = feeStats.get();
        break;
    }
    case FeeEstimateHorizon::LONG_HALFLIFE: {
        stats = longStats.get();
        break;
    }
    } // no default case, so the compiler can warn about missing cases
    assert(stats);

    LOCK(m_cs_fee_estimator);
    // Return failure if trying to analyze a target we're not tracking
    if (confTarget <= 0 || (unsigned int)confTarget > stats->GetMaxConfirms())
        return CFeeRate(0);
    if (successThreshold > 1)
        return CFeeRate(0);

    double median = stats->EstimateMedianVal(confTarget, sufficientTxs, successThreshold, nBestSeenHeight, result);

    if (median < 0)
        return CFeeRate(0);

    return CFeeRate(llround(median));
}